

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

bool __thiscall
QMimeXMLProvider::load(QMimeXMLProvider *this,QString *fileName,QString *errorMessage)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  uint uVar2;
  int __oflag;
  long in_RDX;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *in_RDI;
  long in_FS_OFFSET;
  QIODevice *unaff_retaddr;
  QMimeTypeParserBase *in_stack_00000008;
  QMimeTypeParser parser;
  QFile file;
  QMimeXMLProvider *in_stack_fffffffffffffea8;
  enum_type in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  bool local_f9;
  _func_int **local_18;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> errorMessage_00;
  QString *fileName_00;
  
  fileName_00 = *(QString **)(in_FS_OFFSET + 0x28);
  local_18 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  errorMessage_00.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (QString *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  QVar1 = ::operator|(CONCAT13(in_stack_fffffffffffffeb7,
                               CONCAT12(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb4)),
                      in_stack_fffffffffffffeb0);
  uVar2 = QFile::open((QFile *)&local_18,
                      (char *)(ulong)(uint)QVar1.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                      __oflag);
  if ((uVar2 & 1) == 0) {
    if (in_RDX != 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_RDI,
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,
                                   CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))));
      ::operator+((QLatin1String *)
                  CONCAT17(in_stack_fffffffffffffeb7,
                           CONCAT16(in_stack_fffffffffffffeb6,
                                    CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
                  (QString *)in_stack_fffffffffffffea8);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_RDI,
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,
                                   CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))));
      ::operator+((QStringBuilder<QLatin1String,_const_QString_&> *)
                  CONCAT17(in_stack_fffffffffffffeb7,
                           CONCAT16(in_stack_fffffffffffffeb6,
                                    CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
                  (QLatin1String *)in_stack_fffffffffffffea8);
      QIODevice::errorString((QIODevice *)in_RDI);
      ::operator+(in_RDI,(QString *)
                         CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(in_stack_fffffffffffffeb6,
                                           CONCAT24(in_stack_fffffffffffffeb4,
                                                    in_stack_fffffffffffffeb0))));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
                  *)in_stack_fffffffffffffea8);
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(in_stack_fffffffffffffeb6,
                                           CONCAT24(in_stack_fffffffffffffeb4,
                                                    in_stack_fffffffffffffeb0))),
                         (QString *)in_stack_fffffffffffffea8);
      QString::~QString((QString *)0x8fe60f);
      QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
                         *)0x8fe61c);
      QString::~QString((QString *)0x8fe626);
    }
    local_f9 = false;
  }
  else {
    if (in_RDX != 0) {
      QString::clear((QString *)
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,
                                       CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      )));
    }
    QMimeTypeParser::QMimeTypeParser
              ((QMimeTypeParser *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
               in_stack_fffffffffffffea8);
    local_f9 = QMimeTypeParserBase::parse
                         (in_stack_00000008,unaff_retaddr,fileName_00,(QString *)errorMessage_00.d);
    QMimeTypeParser::~QMimeTypeParser((QMimeTypeParser *)0x8fe704);
  }
  QFile::~QFile((QFile *)0x8fe731);
  if (*(QString **)(in_FS_OFFSET + 0x28) == fileName_00) {
    return local_f9;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeXMLProvider::load(const QString &fileName, QString *errorMessage)
{
    QFile file(fileName);
    if (!file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        if (errorMessage)
            *errorMessage = "Cannot open "_L1 + fileName + ": "_L1 + file.errorString();
        return false;
    }

    if (errorMessage)
        errorMessage->clear();

    QMimeTypeParser parser(*this);
    return parser.parse(&file, fileName, errorMessage);
}